

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

FieldType __thiscall
google::protobuf::internal::ExtensionSet::ExtensionType(ExtensionSet *this,int number)

{
  LogMessage *this_00;
  Extension *ext;
  LogMessage *in_stack_ffffffffffffff38;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff50;
  ExtensionSet *in_stack_ffffffffffffff58;
  LogMessage local_a0;
  undefined1 local_58 [56];
  Extension *local_20;
  FieldType local_1;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_20 = FindOrNull(in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  if (local_20 == (Extension *)0x0) {
    LogMessage::LogMessage
              (in_stack_ffffffffffffff50,(LogLevel_conflict)((ulong)local_58 >> 0x20),
               (char *)in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    LogMessage::operator<<(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    LogFinisher::operator=((LogFinisher *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    LogMessage::~LogMessage((LogMessage *)0x48d430);
    local_1 = '\0';
  }
  else {
    if ((local_20->field_0xa & 1) != 0) {
      other = &local_a0;
      LogMessage::LogMessage
                (in_stack_ffffffffffffff50,level,(char *)in_stack_ffffffffffffff40,
                 (int)((ulong)other >> 0x20));
      this_00 = LogMessage::operator<<(in_stack_ffffffffffffff40,(char *)other);
      LogFinisher::operator=((LogFinisher *)this_00,other);
      LogMessage::~LogMessage((LogMessage *)0x48d4bc);
    }
    local_1 = local_20->type;
  }
  return local_1;
}

Assistant:

FieldType ExtensionSet::ExtensionType(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == NULL) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (1). ";
    return 0;
  }
  if (ext->is_cleared) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (2). ";
  }
  return ext->type;
}